

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

String * __thiscall luna::Function::SearchLocalVar(Function *this,int register_id,int pc)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_> *in_RDI;
  LocalVarInfo *var;
  const_iterator __end1;
  const_iterator __begin1;
  vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_> *__range1;
  int end_pc;
  int begin_pc;
  String *name;
  reference in_stack_ffffffffffffffc0;
  __normal_iterator<const_luna::Function::LocalVarInfo_*,_std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>_>
  local_30;
  vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_> *local_28;
  int local_20;
  int local_1c;
  String *local_18;
  int local_10;
  int local_c;
  
  local_18 = (String *)0x0;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_1c = std::numeric_limits<int>::min();
  local_20 = std::numeric_limits<int>::max();
  local_28 = in_RDI + 4;
  local_30._M_current =
       (LocalVarInfo *)
       std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>::
       begin(in_RDI);
  std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>::end
            (in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_luna::Function::LocalVarInfo_*,_std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>_>
                             *)in_stack_ffffffffffffffc0,
                            (__normal_iterator<const_luna::Function::LocalVarInfo_*,_std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>_>
                             *)in_RDI), bVar1) {
    in_stack_ffffffffffffffc0 =
         __gnu_cxx::
         __normal_iterator<const_luna::Function::LocalVarInfo_*,_std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>_>
         ::operator*(&local_30);
    if ((((in_stack_ffffffffffffffc0->register_id_ == local_c) &&
         (in_stack_ffffffffffffffc0->begin_pc_ <= local_10)) &&
        (local_10 < in_stack_ffffffffffffffc0->end_pc_)) &&
       ((local_1c <= in_stack_ffffffffffffffc0->begin_pc_ &&
        (in_stack_ffffffffffffffc0->end_pc_ <= local_20)))) {
      local_18 = in_stack_ffffffffffffffc0->name_;
      local_1c = in_stack_ffffffffffffffc0->begin_pc_;
      local_20 = in_stack_ffffffffffffffc0->end_pc_;
    }
    __gnu_cxx::
    __normal_iterator<const_luna::Function::LocalVarInfo_*,_std::vector<luna::Function::LocalVarInfo,_std::allocator<luna::Function::LocalVarInfo>_>_>
    ::operator++(&local_30);
  }
  return local_18;
}

Assistant:

String * Function::SearchLocalVar(int register_id, int pc) const
    {
        String *name = nullptr;
        int begin_pc = std::numeric_limits<int>::min();
        int end_pc = std::numeric_limits<int>::max();

        for (const auto &var : local_vars_)
        {
            if (var.register_id_ == register_id &&
                var.begin_pc_ <= pc && pc < var.end_pc_)
            {
                if (var.begin_pc_ >= begin_pc && var.end_pc_ <= end_pc)
                {
                    name = var.name_;
                    begin_pc = var.begin_pc_;
                    end_pc = var.end_pc_;
                }
            }
        }

        return name;
    }